

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::str<unsigned_long&,char_const(&)[2],unsigned_long&>
          (String *__return_storage_ptr__,kj *this,unsigned_long *params,char (*params_1) [2],
          unsigned_long *params_2)

{
  undefined1 local_90 [56];
  CappedArray<char,_26UL> local_58;
  
  _::Stringifier::operator*(&local_58,(Stringifier *)&_::STR,*(unsigned_long *)this);
  local_90._8_8_ = strlen((char *)params);
  local_90._0_8_ = params;
  _::Stringifier::operator*
            ((CappedArray<char,_26UL> *)(local_90 + 0x10),(Stringifier *)&_::STR,
             *(unsigned_long *)params_1);
  _::concat<kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>>
            (__return_storage_ptr__,(_ *)&local_58,(CappedArray<char,_26UL> *)local_90,
             (ArrayPtr<const_char> *)(local_90 + 0x10),(CappedArray<char,_26UL> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}